

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O0

void resizeFramebuffer(_GLFWwindow *window)

{
  long in_RDI;
  
  if (*(long *)(in_RDI + 0x430) == 0) {
    *(int *)(in_RDI + 0x360) = *(int *)(in_RDI + 0x358) * *(int *)(in_RDI + 0x400);
    *(int *)(in_RDI + 0x364) = *(int *)(in_RDI + 0x35c) * *(int *)(in_RDI + 0x400);
  }
  else {
    *(uint *)(in_RDI + 0x360) = (uint)(*(int *)(in_RDI + 0x358) * *(int *)(in_RDI + 0x428)) / 0x78;
    *(uint *)(in_RDI + 0x364) = (uint)(*(int *)(in_RDI + 0x35c) * *(int *)(in_RDI + 0x428)) / 0x78;
  }
  if (*(long *)(in_RDI + 0x398) != 0) {
    (*_glfw.wl.egl.window_resize)
              (*(wl_egl_window **)(in_RDI + 0x398),*(int *)(in_RDI + 0x360),*(int *)(in_RDI + 0x364)
               ,0,0);
  }
  if (*(int *)(in_RDI + 0x37c) == 0) {
    setContentAreaOpaque(window);
  }
  _glfwInputFramebufferSize(window,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  return;
}

Assistant:

static void resizeFramebuffer(_GLFWwindow* window)
{
    if (window->wl.fractionalScale)
    {
        window->wl.fbWidth = (window->wl.width * window->wl.scalingNumerator) / 120;
        window->wl.fbHeight = (window->wl.height * window->wl.scalingNumerator) / 120;
    }
    else
    {
        window->wl.fbWidth = window->wl.width * window->wl.bufferScale;
        window->wl.fbHeight = window->wl.height * window->wl.bufferScale;
    }

    if (window->wl.egl.window)
    {
        wl_egl_window_resize(window->wl.egl.window,
                             window->wl.fbWidth,
                             window->wl.fbHeight,
                             0, 0);
    }

    if (!window->wl.transparent)
        setContentAreaOpaque(window);

    _glfwInputFramebufferSize(window, window->wl.fbWidth, window->wl.fbHeight);
}